

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_BtFindBestMatch_selectMLS(ZSTD_matchState_t *ms,BYTE *ip,BYTE *iLimit,size_t *offsetPtr)

{
  uint uVar1;
  size_t *offsetPtr_local;
  BYTE *iLimit_local;
  BYTE *ip_local;
  ZSTD_matchState_t *ms_local;
  size_t local_70;
  size_t local_40;
  size_t local_10;
  
  uVar1 = (ms->cParams).minMatch;
  if (uVar1 != 4) {
    if (uVar1 == 5) {
      if (ip < (ms->window).base + ms->nextToUpdate) {
        local_40 = 0;
      }
      else {
        ZSTD_updateDUBT(ms,ip,iLimit,5);
        local_40 = ZSTD_DUBT_findBestMatch(ms,ip,iLimit,offsetPtr,5,ZSTD_noDict);
      }
      return local_40;
    }
    if (uVar1 - 6 < 2) {
      if (ip < (ms->window).base + ms->nextToUpdate) {
        local_70 = 0;
      }
      else {
        ZSTD_updateDUBT(ms,ip,iLimit,6);
        local_70 = ZSTD_DUBT_findBestMatch(ms,ip,iLimit,offsetPtr,6,ZSTD_noDict);
      }
      return local_70;
    }
  }
  if (ip < (ms->window).base + ms->nextToUpdate) {
    local_10 = 0;
  }
  else {
    ZSTD_updateDUBT(ms,ip,iLimit,4);
    local_10 = ZSTD_DUBT_findBestMatch(ms,ip,iLimit,offsetPtr,4,ZSTD_noDict);
  }
  return local_10;
}

Assistant:

static size_t
ZSTD_BtFindBestMatch_selectMLS (  ZSTD_matchState_t* ms,
                            const BYTE* ip, const BYTE* const iLimit,
                                  size_t* offsetPtr)
{
    switch(ms->cParams.minMatch)
    {
    default : /* includes case 3 */
    case 4 : return ZSTD_BtFindBestMatch(ms, ip, iLimit, offsetPtr, 4, ZSTD_noDict);
    case 5 : return ZSTD_BtFindBestMatch(ms, ip, iLimit, offsetPtr, 5, ZSTD_noDict);
    case 7 :
    case 6 : return ZSTD_BtFindBestMatch(ms, ip, iLimit, offsetPtr, 6, ZSTD_noDict);
    }
}